

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  ImDrawCmd *in_RDI;
  ImDrawCmd draw_cmd;
  ImDrawCmd *in_stack_ffffffffffffffa8;
  float local_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  
  ImDrawCmd::ImDrawCmd(in_RDI);
  uVar1 = in_RDI[2].VtxOffset;
  uVar2 = in_RDI[2].IdxOffset;
  local_38 = (float)*(undefined8 *)&in_RDI[2].ElemCount;
  bVar3 = false;
  if ((float)uVar1 <= local_38) {
    fStack_34 = (float)((ulong)*(undefined8 *)&in_RDI[2].ElemCount >> 0x20);
    bVar3 = (float)uVar2 <= fStack_34;
  }
  if (!bVar3) {
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  ImVector<ImDrawCmd>::push_back((ImVector<ImDrawCmd> *)in_RDI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}